

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.h
# Opt level: O0

void tpl_dealloc_temp_buffers(TplBuffers *tpl_tmp_buffers)

{
  undefined8 *in_RDI;
  
  aom_free(tpl_tmp_buffers);
  *in_RDI = 0;
  aom_free(tpl_tmp_buffers);
  in_RDI[1] = 0;
  aom_free(tpl_tmp_buffers);
  in_RDI[2] = 0;
  aom_free(tpl_tmp_buffers);
  in_RDI[3] = 0;
  aom_free(tpl_tmp_buffers);
  in_RDI[4] = 0;
  return;
}

Assistant:

static inline void tpl_dealloc_temp_buffers(TplBuffers *tpl_tmp_buffers) {
  aom_free(tpl_tmp_buffers->predictor8);
  tpl_tmp_buffers->predictor8 = NULL;
  aom_free(tpl_tmp_buffers->src_diff);
  tpl_tmp_buffers->src_diff = NULL;
  aom_free(tpl_tmp_buffers->coeff);
  tpl_tmp_buffers->coeff = NULL;
  aom_free(tpl_tmp_buffers->qcoeff);
  tpl_tmp_buffers->qcoeff = NULL;
  aom_free(tpl_tmp_buffers->dqcoeff);
  tpl_tmp_buffers->dqcoeff = NULL;
}